

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O1

double __thiscall libDAI::HAK::doGBP(HAK *this)

{
  pointer pTVar1;
  _func_int *p_Var2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_type __n;
  undefined4 extraout_var_03;
  ulong uVar6;
  undefined4 extraout_var_04;
  undefined8 uVar7;
  undefined4 extraout_var_05;
  long lVar8;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  long *plVar9;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  iterator iVar10;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  long lVar11;
  pointer pTVar12;
  long lVar13;
  ulong uVar14;
  long *plVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_ZMM2 [64];
  Diffs diffs;
  Factor Qb_new;
  Factor Qa_new;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> old_beliefs;
  ulong local_1d0;
  undefined1 local_1c0 [24];
  ulong local_1a8;
  pointer local_1a0 [2];
  iterator local_190;
  TFactor<double> local_188;
  TFactor<double> local_150;
  clock_t local_118;
  pointer local_110;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> local_108;
  long local_f0;
  long *local_e8;
  double local_e0;
  TFactor<double> local_d8;
  TFactor<double> local_a0;
  TFactor<double> local_68;
  
  iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])();
  if (CONCAT44(extraout_var,iVar4) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Starting ",9);
    (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[9])(local_1c0,this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_1c0._0_8_,local_1c0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"...",3);
    if ((pointer)local_1c0._0_8_ != (pointer)(local_1c0 + 0x10)) {
      operator_delete((void *)local_1c0._0_8_,(ulong)((long)(long *)local_1c0._16_8_ + 1));
    }
  }
  iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
  if (2 < CONCAT44(extraout_var_00,iVar4)) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    std::ostream::flush();
  }
  uVar14 = 0xffffffffffffffff;
  local_118 = toc();
  do {
    iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar14 = uVar14 + 1;
  } while (uVar14 < (ulong)((*(long *)(CONCAT44(extraout_var_01,iVar4) + 0x100) -
                             *(long *)(CONCAT44(extraout_var_01,iVar4) + 0xf8) >> 3) *
                           -0x3333333333333333));
  local_108.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  __n = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x28))
                  ((long *)CONCAT44(extraout_var_02,iVar4));
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::reserve
            (&local_108,__n);
  uVar14 = 0;
  while( true ) {
    iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar4) + 0x28))
                      ((long *)CONCAT44(extraout_var_03,iVar4));
    if (uVar6 <= uVar14) break;
    iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
    uVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar4) + 0x30))
                      ((long *)CONCAT44(extraout_var_04,iVar4),uVar14);
    (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[10])
              ((TFactor<double> *)local_1c0,this,uVar7);
    std::vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>>::
    emplace_back<libDAI::TFactor<double>>
              ((vector<libDAI::TFactor<double>,std::allocator<libDAI::TFactor<double>>> *)&local_108
               ,(TFactor<double> *)local_1c0);
    if (local_1a0[0] != (pointer)0x0) {
      operator_delete(local_1a0[0],(long)local_190._M_current - (long)local_1a0[0]);
    }
    if ((pointer)local_1c0._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ - local_1c0._0_8_);
    }
    uVar14 = uVar14 + 1;
  }
  iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  lVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar4) + 0x28))
                    ((long *)CONCAT44(extraout_var_05,iVar4));
  Diffs::Diffs((Diffs *)local_1c0,lVar8,1.0);
  this->_iterations = 0;
  if ((this->Props).maxiter != 0) {
    local_110 = (pointer)0x7ff8000000000000;
    while( true ) {
      iVar10._M_current = (double *)local_1a0;
      if (local_1a8 <= (ulong)((long)(local_1c0._8_8_ - local_1c0._0_8_) >> 3)) {
        iVar10._M_current = local_190._M_current;
      }
      if ((double)*iVar10._M_current <= (this->Props).tol) break;
      local_1d0 = 0;
      while (iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                               (this),
            local_1d0 <
            (ulong)((*(long *)(CONCAT44(extraout_var_06,iVar4) + 0x100) -
                     *(long *)(CONCAT44(extraout_var_06,iVar4) + 0xf8) >> 3) * -0x3333333333333333))
      {
        iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        for (plVar15 = *(long **)(*(long *)(CONCAT44(extraout_var_07,iVar4) + 0x158) +
                                 local_1d0 * 0x18);
            iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                              (this),
            plVar15 !=
            *(long **)(*(long *)(CONCAT44(extraout_var_08,iVar4) + 0x158) + 8 + local_1d0 * 0x18);
            plVar15 = plVar15 + 1) {
          lVar8 = *plVar15;
          pTVar12 = (this->_Qa).
                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          TFactor<double>::marginal
                    (&local_150,pTVar12 + lVar8,
                     (VarSet *)
                     (local_1d0 * 0x28 + *(long *)(CONCAT44(extraout_var_09,iVar4) + 0xf8)),true);
          lVar8 = *plVar15;
          iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          lVar8 = *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_10,iVar4) + 0x128) +
                                     lVar8 * 0x18) + local_1d0 * 8);
          pTVar12 = (this->_muba).
                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          TFactor<double>::TFactor(&local_188,&local_150);
          if ((long)local_188._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_188._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            lVar11 = (long)local_188._p._p.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_188._p._p.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3;
            lVar8 = *(long *)&pTVar12[lVar8]._p._p.
                              super__Vector_base<double,_std::allocator<double>_>;
            lVar13 = 0;
            do {
              dVar18 = *(double *)(lVar8 + lVar13 * 8);
              dVar16 = 0.0;
              if ((dVar18 != 0.0) || (NAN(dVar18))) {
                dVar16 = local_188._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start[lVar13] / dVar18;
              }
              local_188._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13] = dVar16;
              lVar13 = lVar13 + 1;
            } while (lVar11 + (ulong)(lVar11 == 0) != lVar13);
          }
          lVar8 = *plVar15;
          iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          TFactor<double>::operator=
                    ((this->_muab).
                     super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_11,iVar4) + 0x128) +
                                        lVar8 * 0x18) + local_1d0 * 8),&local_188);
          if (local_188._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_188._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_188._p._p.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_188._p._p.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_188._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_188._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_188._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_188._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_150._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_150._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_150._p._p.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_150._p._p.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_150._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_150._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_150._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_150._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar8 = *plVar15;
          iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          lVar8 = *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_12,iVar4) + 0x128) +
                                     lVar8 * 0x18) + local_1d0 * 8);
          pTVar12 = (this->_muab).
                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          TProb<double>::normalize
                    (&pTVar12[lVar8]._p,*(NormType *)(CONCAT44(extraout_var_13,iVar4) + 8));
        }
        TFactor<double>::TFactor(&local_188);
        iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        for (plVar15 = *(long **)(*(long *)(CONCAT44(extraout_var_14,iVar4) + 0x158) +
                                 local_1d0 * 0x18);
            iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                              (this),
            plVar15 !=
            *(long **)(*(long *)(CONCAT44(extraout_var_15,iVar4) + 0x158) + 8 + local_1d0 * 0x18);
            plVar15 = plVar15 + 1) {
          lVar8 = *plVar15;
          iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          lVar8 = *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_16,iVar4) + 0x128) +
                                     lVar8 * 0x18) + local_1d0 * 8);
          pTVar12 = (this->_muab).
                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          lVar11 = *(long *)(CONCAT44(extraout_var_17,iVar4) + 0x158);
          lVar13 = *(long *)(lVar11 + local_1d0 * 0x18);
          lVar11 = *(long *)(lVar11 + 8 + local_1d0 * 0x18);
          iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          auVar17 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,lVar11 - lVar13 >> 3);
          TFactor<double>::operator^
                    (&local_150,pTVar12 + lVar8,
                     1.0 / (auVar17._0_8_ +
                           *(double *)
                            (*(long *)(CONCAT44(extraout_var_18,iVar4) + 0xf8) + 0x20 +
                            local_1d0 * 0x28)));
          TFactor<double>::operator*=(&local_188,&local_150);
          if (local_150._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_150._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_150._p._p.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_150._p._p.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_150._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_150._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_150._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_150._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        TProb<double>::normalize(&local_188._p,*(NormType *)(CONCAT44(extraout_var_19,iVar4) + 8));
        if ((long)local_188._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_188._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          uVar14 = 1;
          bVar3 = false;
          do {
            if (NAN(local_188._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar14 - 1])) {
              bVar3 = true;
            }
          } while ((uVar14 < (ulong)((long)local_188._p._p.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_188._p._p.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start >> 3)) &&
                  (uVar14 = uVar14 + 1, !bVar3));
          if (bVar3) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"HAK::doGBP:  Qb_new has NaNs!",0x1d);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
            std::ostream::put(-0x50);
            std::ostream::flush();
            if (local_188._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_188._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_188._p._p.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_188._p._p.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            if (local_188._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_188._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_188._vs._vars.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_188._vs._vars.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            goto LAB_004afee9;
          }
        }
        if ((this->Props).doubleloop == false) {
          dVar18 = (this->Props).damping;
          if ((dVar18 == 0.0) && (!NAN(dVar18))) goto LAB_004af3e4;
          TFactor<double>::operator^(&local_a0,&local_188,1.0 - dVar18);
          TFactor<double>::operator^
                    (&local_d8,
                     (this->_Qb).
                     super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_1d0,(this->Props).damping);
          TFactor<double>::operator*(&local_150,&local_a0,&local_d8);
          TFactor<double>::operator=
                    ((this->_Qb).
                     super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_1d0,&local_150);
          if (local_150._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_150._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_150._p._p.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_150._p._p.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_150._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_150._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_150._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_150._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_d8._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_d8._p._p.super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8._p._p.super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_d8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_d8._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_a0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_a0._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a0._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
LAB_004af3e4:
          TFactor<double>::operator=
                    ((this->_Qb).
                     super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_1d0,&local_188);
        }
        iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        local_f0 = local_1d0 * 0x38;
        plVar15 = *(long **)(*(long *)(CONCAT44(extraout_var_20,iVar4) + 0x158) + local_1d0 * 0x18);
        do {
          plVar9 = plVar15;
          iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          local_e8 = *(long **)(*(long *)(CONCAT44(extraout_var_21,iVar4) + 0x158) + 8 +
                               local_1d0 * 0x18);
          if (plVar9 == local_e8) break;
          pTVar12 = (this->_Qb).
                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar8 = *plVar9;
          iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          lVar8 = *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_22,iVar4) + 0x128) +
                                     lVar8 * 0x18) + local_1d0 * 8);
          pTVar1 = (this->_muab).
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          TFactor<double>::TFactor
                    (&local_150,
                     (TFactor<double> *)
                     ((long)&(pTVar12->_vs)._vars.
                             super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                             super__Vector_impl_data._M_start + local_f0));
          if ((long)local_150._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_150._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            lVar11 = (long)local_150._p._p.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_150._p._p.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3;
            lVar8 = *(long *)&pTVar1[lVar8]._p._p.
                              super__Vector_base<double,_std::allocator<double>_>;
            lVar13 = 0;
            do {
              dVar18 = *(double *)(lVar8 + lVar13 * 8);
              dVar16 = 0.0;
              if ((dVar18 != 0.0) || (NAN(dVar18))) {
                dVar16 = local_150._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start[lVar13] / dVar18;
              }
              local_150._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13] = dVar16;
              lVar13 = lVar13 + 1;
            } while (lVar11 + (ulong)(lVar11 == 0) != lVar13);
          }
          lVar8 = *plVar9;
          iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          TFactor<double>::operator=
                    ((this->_muba).
                     super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_23,iVar4) + 0x128) +
                                        lVar8 * 0x18) + local_1d0 * 8),&local_150);
          if (local_150._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_150._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_150._p._p.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_150._p._p.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_150._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_150._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_150._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_150._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          TFactor<double>::TFactor
                    (&local_150,
                     (TFactor<double> *)
                     (*plVar9 * 0x40 + *(long *)(CONCAT44(extraout_var_24,iVar4) + 0xe0)));
          iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          plVar15 = *(long **)(*(long *)(CONCAT44(extraout_var_25,iVar4) + 0x140) + *plVar9 * 0x18);
          while( true ) {
            iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                              (this);
            lVar8 = *plVar9;
            if (plVar15 ==
                *(long **)(*(long *)(CONCAT44(extraout_var_26,iVar4) + 0x140) + 8 + lVar8 * 0x18))
            break;
            lVar11 = *plVar15;
            iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                              (this);
            TFactor<double>::operator*=
                      (&local_150,
                       (this->_muba).
                       super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       *(long *)(*(long *)(*(long *)(CONCAT44(extraout_var_27,iVar4) + 0x128) +
                                          lVar8 * 0x18) + lVar11 * 8));
            plVar15 = plVar15 + 1;
          }
          iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          dVar18 = 1.0 / *(double *)
                          (*(long *)(CONCAT44(extraout_var_28,iVar4) + 0xe0) + 0x38 + *plVar9 * 0x40
                          );
          if (((dVar18 != 1.0) || (NAN(dVar18))) &&
             (local_150._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_150._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start)) {
            uVar14 = 0;
            local_e0 = dVar18;
            do {
              dVar18 = pow(local_150._p._p.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar14],local_e0);
              local_150._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar14] = dVar18;
              uVar14 = uVar14 + 1;
            } while (uVar14 < (ulong)((long)local_150._p._p.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_150._p._p.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 3));
          }
          iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])
                            (this);
          TProb<double>::normalize(&local_150._p,*(NormType *)(CONCAT44(extraout_var_29,iVar4) + 8))
          ;
          if ((long)local_150._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_150._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start == 0) {
            bVar3 = false;
          }
          else {
            uVar14 = 1;
            bVar3 = false;
            do {
              if (NAN(local_150._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar14 - 1])) {
                bVar3 = true;
              }
            } while ((uVar14 < (ulong)((long)local_150._p._p.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_150._p._p.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start >> 3)) &&
                    (uVar14 = uVar14 + 1, !bVar3));
          }
          if (bVar3) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"HAK::doGBP:  Qa_new has NaNs!",0x1d);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
            std::ostream::put(-0x50);
            std::ostream::flush();
          }
          else {
            if ((this->Props).doubleloop == false) {
              dVar18 = (this->Props).damping;
              if ((dVar18 != 0.0) || (NAN(dVar18))) {
                TFactor<double>::operator^(&local_d8,&local_150,1.0 - dVar18);
                TFactor<double>::operator^
                          (&local_68,
                           (this->_Qa).
                           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + *plVar9,(this->Props).damping
                          );
                TFactor<double>::operator*(&local_a0,&local_d8,&local_68);
                TFactor<double>::operator=
                          ((this->_Qa).
                           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + *plVar9,&local_a0);
                if (local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_a0._p._p.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)local_a0._p._p.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                if (local_a0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_a0._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_a0._vs._vars.
                                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_a0._vs._vars.
                                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_68._p._p.super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_68._p._p.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)local_68._p._p.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                if (local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_68._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_68._vs._vars.
                                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_68._vs._vars.
                                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (local_d8._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_d8._p._p.super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_d8._p._p.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)local_d8._p._p.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                if (local_d8._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_d8._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_d8._vs._vars.
                                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_d8._vs._vars.
                                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                goto LAB_004af749;
              }
            }
            TFactor<double>::operator=
                      ((this->_Qa).
                       super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + *plVar9,&local_150);
          }
LAB_004af749:
          if (local_150._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_150._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_150._p._p.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_150._p._p.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_150._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_150._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_150._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_150._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          plVar15 = plVar9 + 1;
        } while (!bVar3);
        if (local_188._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_188._p._p.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_188._p._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_188._p._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_188._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_188._vs._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_188._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_188._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_1d0 = local_1d0 + 1;
        if (plVar9 != local_e8) goto LAB_004afee9;
      }
      uVar14 = 0;
      while( true ) {
        iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_30,iVar4) + 0x28))
                          ((long *)CONCAT44(extraout_var_30,iVar4));
        if (uVar6 <= uVar14) break;
        iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this)
        ;
        uVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_31,iVar4) + 0x30))
                          ((long *)CONCAT44(extraout_var_31,iVar4),uVar14);
        (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[10])
                  (&local_188,this,uVar7);
        dVar18 = -1.0;
        if (local_188._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_188._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          pTVar12 = local_108.
                    super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar14;
          dVar18 = -1.0;
          if ((pTVar12->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (pTVar12->_vs)._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            if ((long)local_188._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_188._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start == 0) {
              dVar18 = 0.0;
            }
            else {
              lVar8 = (long)local_188._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_188._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3;
              auVar17 = ZEXT816(0);
              lVar11 = 0;
              auVar20._8_8_ = 0x7fffffffffffffff;
              auVar20._0_8_ = 0x7fffffffffffffff;
              in_ZMM2 = ZEXT1664(auVar20);
              do {
                auVar19._8_8_ = 0;
                auVar19._0_8_ =
                     local_188._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar11] -
                     (pTVar12->_p)._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar11];
                auVar19 = vandpd_avx(auVar19,auVar20);
                auVar17 = vmaxsd_avx(auVar19,auVar17);
                dVar18 = auVar17._0_8_;
                lVar11 = lVar11 + 1;
              } while (lVar8 + (ulong)(lVar8 == 0) != lVar11);
            }
          }
        }
        Diffs::push((Diffs *)local_1c0,dVar18);
        TFactor<double>::operator=
                  (local_108.
                   super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar14,&local_188);
        if (local_188._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_188._p._p.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_188._p._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_188._p._p.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_188._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_188._vs._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_188._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_188._vs._vars.
                                super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar14 = uVar14 + 1;
      }
      iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
      if (2 < CONCAT44(extraout_var_32,iVar4)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"HAK::doGBP:  maxdiff ",0x15);
        iVar10._M_current = (double *)local_1a0;
        if (local_1a8 <= (ulong)((long)(local_1c0._8_8_ - local_1c0._0_8_) >> 3)) {
          iVar10._M_current = local_190._M_current;
        }
        poVar5 = std::ostream::_M_insert<double>((double)*iVar10._M_current);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," after ",7);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," passes",7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      uVar14 = this->_iterations + 1;
      this->_iterations = uVar14;
      if ((this->Props).maxiter <= uVar14) break;
    }
  }
  iVar10._M_current = (double *)local_1a0;
  if (local_1a8 <= (ulong)((long)(local_1c0._8_8_ - local_1c0._0_8_) >> 3)) {
    iVar10._M_current = local_190._M_current;
  }
  if (this->_maxdiff < *iVar10._M_current) {
    this->_maxdiff = (double)*iVar10._M_current;
  }
  iVar4 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6])(this);
  if (CONCAT44(extraout_var_33,iVar4) != 0) {
    iVar10._M_current = (double *)local_1a0;
    if (local_1a8 <= (ulong)((long)(local_1c0._8_8_ - local_1c0._0_8_) >> 3)) {
      iVar10._M_current = local_190._M_current;
    }
    p_Var2 = (this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[6];
    if ((double)*iVar10._M_current <= (this->Props).tol) {
      iVar4 = (*p_Var2)(this);
      if (1 < CONCAT44(extraout_var_35,iVar4)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"HAK::doGBP:  ",0xd);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"converged in ",0xd);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," passes (",9);
      toc();
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," clocks).",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    }
    else {
      iVar4 = (*p_Var2)(this);
      if (CONCAT44(extraout_var_34,iVar4) == 1) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
        std::ostream::put(-0x50);
        std::ostream::flush();
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"HAK::doGBP:  WARNING: not converged within ",0x2b);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," passes (",9);
      toc();
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," clocks)...final maxdiff:",0x19);
      iVar10._M_current = (double *)local_1a0;
      if (local_1a8 <= (ulong)((long)(local_1c0._8_8_ - local_1c0._0_8_) >> 3)) {
        iVar10._M_current = local_190._M_current;
      }
      poVar5 = std::ostream::_M_insert<double>((double)*iVar10._M_current);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    }
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  iVar10._M_current = (double *)local_1a0;
  if (local_1a8 <= (ulong)((long)(local_1c0._8_8_ - local_1c0._0_8_) >> 3)) {
    iVar10._M_current = local_190._M_current;
  }
  local_110 = (pointer)*iVar10._M_current;
LAB_004afee9:
  if ((pointer)local_1c0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ - local_1c0._0_8_);
  }
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::~vector
            (&local_108);
  return (double)local_110;
}

Assistant:

double HAK::doGBP() {
        if( Verbose() >= 1 )
            cout << "Starting " << identify() << "...";
        if( Verbose() >= 3)
            cout << endl;

// TODO: FIND OUT WHETHER IT WOULD BE USEFUL TO CATCH NANS BY TRAPPING FLOATING POINT EXCEPTIONS
//      feenableexcept(FE_DIVBYZERO | FE_INVALID | FE_OVERFLOW | FE_UNDERFLOW);

        clock_t tic = toc();

        // Check whether counting numbers won't lead to problems
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            assert( grm().nbIR(beta).size() + grm().IR(beta).c() != 0.0 );

        // Keep old beliefs to check convergence
        vector<Factor> old_beliefs;
        old_beliefs.reserve( grm().nrVars() );
        for( size_t i = 0; i < grm().nrVars(); i++ )
            old_beliefs.push_back( belief( grm().var(i) ) );

        // Differences in single node beliefs
        Diffs diffs(grm().nrVars(), 1.0);

        // do several passes over the network until maximum number of iterations has
        // been reached or until the maximum belief difference is smaller than tolerance
        for( _iterations = 0; _iterations < Props.maxiter && diffs.max() > Props.tol; _iterations++ ) {
            for( size_t beta = 0; beta < grm().nr_IRs(); beta++ ) {
                for( RegionGraph::R_nb_cit alpha = grm().nbIR(beta).begin(); alpha != grm().nbIR(beta).end(); alpha++ ) {
                    muab(*alpha,beta) = _Qa[*alpha].marginal(grm().IR(beta)).divided_by( muba(beta,*alpha) );
                    /* TODO: INVESTIGATE THIS PROBLEM
                     *
                     * In some cases, the muab's can have very large entries because the muba's have very
                     * small entries. This may cause NANs later on (e.g., multiplying large quantities may
                     * result in +inf; normalization then tries to calculate inf / inf which is NAN). 
                     * A fix of this problem would consist in normalizing the messages muab.
                     * However, it is not obvious whether this is a real solution, because it has a
                     * negative performance impact and the NAN's seem to be a symptom of a fundamental
                     * numerical unstability.
                     */
                     muab(*alpha,beta).normalize( grm().normType() ); 
                }

                Factor Qb_new;
                for( RegionGraph::R_nb_cit alpha = grm().nbIR(beta).begin(); alpha != grm().nbIR(beta).end(); alpha++ )
                    Qb_new *= muab(*alpha,beta) ^ (1 / (grm().nbIR(beta).size() + grm().IR(beta).c()));
                Qb_new.normalize( grm().normType() );
                if( Qb_new.hasNaNs() ) {
                    // TODO: WHAT TO DO IN THIS CASE?
                    cout << "HAK::doGBP:  Qb_new has NaNs!" << endl;
                    return NAN;
                }
                /* TODO: WHAT IS THE PURPOSE OF THE FOLLOWING CODE?
                 *
                 *   _Qb[beta] = Qb_new.makeZero(1e-100);
                 */

                if( Props.doubleloop || Props.damping == 0.0 )
                    _Qb[beta] = Qb_new; // no damping for double loop
                else
                    _Qb[beta] = (Qb_new^(1.0 - Props.damping)) * (_Qb[beta]^Props.damping);

                for( RegionGraph::R_nb_cit alpha = grm().nbIR(beta).begin(); alpha != grm().nbIR(beta).end(); alpha++ ) {
                    muba(beta,*alpha) = _Qb[beta].divided_by( muab(*alpha,beta) );

                    /* TODO: INVESTIGATE WHETHER THIS HACK (INVENTED BY KEES) TO PREVENT NANS MAKES SENSE 
                     *
                     *   muba(beta,*alpha).makePositive(1e-100);
                     *
                     */

                    Factor Qa_new = grm().OR(*alpha);
                    for( RegionGraph::R_nb_cit gamma = grm().nbOR(*alpha).begin(); gamma != grm().nbOR(*alpha).end(); gamma++ )
                        Qa_new *= muba(*gamma,*alpha);
                    Qa_new ^= (1.0 / grm().OR(*alpha).c());
                    Qa_new.normalize( grm().normType() );
                    if( Qa_new.hasNaNs() ) {
                        cout << "HAK::doGBP:  Qa_new has NaNs!" << endl;
                        return NAN;
                    }
                    /* TODO: WHAT IS THE PURPOSE OF THE FOLLOWING CODE?
                     *
                     *   _Qb[beta] = Qb_new.makeZero(1e-100);
                     */

                if( Props.doubleloop || Props.damping == 0.0 )
                    _Qa[*alpha] = Qa_new; // no damping for double loop
                else
                    // FIXME: GEOMETRIC DAMPING IS SLOW!
                    _Qa[*alpha] = (Qa_new^(1.0 - Props.damping)) * (_Qa[*alpha]^Props.damping);
                }
            }

            // Calculate new single variable beliefs and compare with old ones
            for( size_t i = 0; i < grm().nrVars(); i++ ) {
                Factor new_belief = belief( grm().var( i ) );
                diffs.push( dist( new_belief, old_beliefs[i], Prob::DISTLINF ) );
                old_beliefs[i] = new_belief;
            }

            if( Verbose() >= 3 )
                cout << "HAK::doGBP:  maxdiff " << diffs.max() << " after " << _iterations+1 << " passes" << endl;
        }

        if( diffs.max() > _maxdiff )
            _maxdiff = diffs.max();

        if( Verbose() >= 1 ) {
            if( diffs.max() > Props.tol ) {
                if( Verbose() == 1 )
                    cout << endl;
                cout << "HAK::doGBP:  WARNING: not converged within " << Props.maxiter << " passes (" << toc() - tic << " clocks)...final maxdiff:" << diffs.max() << endl;
            } else {
                if( Verbose() >= 2 )
                    cout << "HAK::doGBP:  ";
                cout << "converged in " << _iterations << " passes (" << toc() - tic << " clocks)." << endl;
            }
        }

        return diffs.max();
    }